

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdKelvinDepthClamp::emulate_mthd(MthdKelvinDepthClamp *this)

{
  pgraph_state *state;
  _Bool _Var1;
  uint uVar2;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  pgraph_kelvin_check_err18(state);
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
    uVar2 = (uVar2 & 1) << 0x1e |
            uVar2 >> 3 & 0x20 |
            (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster &
            0xbfffffdf;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster = uVar2;
    pgraph_bundle(state,0x13,0,uVar2,true);
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.val & 0x10 |
            (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_z_config &
            0xffffffef;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_z_config = uVar2;
    pgraph_bundle(state,0x42,0,uVar2,true);
    _Var1 = nv04_pgraph_is_rankine_class(state);
    if ((_Var1) &&
       ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.card_type < 0x40)) {
      uVar2 = ((this->super_SingleMthdTest).super_MthdTest.val & 0x1000) << 0x13 |
              (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_ps_control &
              0x7fffffff;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_ps_control = uVar2;
      pgraph_bundle(state,0x52,0,uVar2,true);
      return;
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		pgraph_kelvin_check_err18(&exp);
		if (!exp.nsource) {
			insrt(exp.bundle_raster, 5, 1, extr(val, 8, 1));
			insrt(exp.bundle_raster, 30, 1, extr(val, 0, 1));
			pgraph_bundle(&exp, BUNDLE_RASTER, 0, exp.bundle_raster, true);
			insrt(exp.bundle_z_config, 4, 1, extr(val, 4, 1));
			pgraph_bundle(&exp, BUNDLE_Z_CONFIG, 0, exp.bundle_z_config, true);
			if (nv04_pgraph_is_rankine_class(&exp) && chipset.card_type < 0x40) {
				insrt(exp.bundle_ps_control, 31, 1, extr(val, 12, 1));
				pgraph_bundle(&exp, BUNDLE_PS_CONTROL, 0, exp.bundle_ps_control, true);
			}
		}
	}